

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibScl.c
# Opt level: O3

SC_Lib * Abc_SclReadFromGenlib(void *pLib0)

{
  int iVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  Mio_PinPhase_t MVar5;
  SC_Lib *p;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  Mio_Gate_t *pGate;
  undefined8 *puVar9;
  void **ppvVar10;
  Mio_Pin_t *pMVar11;
  undefined8 *puVar12;
  void *pvVar13;
  word *pwVar14;
  undefined8 *puVar15;
  void *pvVar16;
  uint uVar17;
  Vec_Wrd_t *p_00;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  
  p = (SC_Lib *)calloc(1,0x90);
  pcVar6 = Mio_LibraryReadName((Mio_Library_t *)pLib0);
  if (pcVar6 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar6);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar6);
  }
  p->pName = pcVar8;
  p->unit_time = 0xc;
  p->unit_cap_fst = 1.0;
  p->unit_cap_snd = 0xf;
  pGate = Mio_LibraryReadGates((Mio_Library_t *)pLib0);
  if (pGate != (Mio_Gate_t *)0x0) {
    uVar19 = 0;
    uVar17 = 0;
    do {
      puVar9 = (undefined8 *)calloc(1,0x70);
      *(uint *)(puVar9 + 1) = uVar17;
      uVar18 = (uint)uVar19;
      if (uVar17 == uVar18) {
        if ((int)uVar18 < 0x10) {
          ppvVar10 = (p->vCells).pArray;
          if (ppvVar10 == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(ppvVar10,0x80);
          }
          (p->vCells).pArray = ppvVar10;
          (p->vCells).nCap = 0x10;
          uVar19 = 0x10;
        }
        else {
          uVar19 = (ulong)(uVar18 * 2);
          ppvVar10 = (p->vCells).pArray;
          if (ppvVar10 == (void **)0x0) {
            ppvVar10 = (void **)malloc(uVar19 * 8);
          }
          else {
            ppvVar10 = (void **)realloc(ppvVar10,uVar19 * 8);
          }
          (p->vCells).pArray = ppvVar10;
          (p->vCells).nCap = uVar18 * 2;
        }
      }
      else {
        ppvVar10 = (p->vCells).pArray;
      }
      (p->vCells).nSize = uVar17 + 1;
      ppvVar10[uVar17] = puVar9;
      pcVar6 = Mio_GateReadName(pGate);
      if (pcVar6 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        sVar7 = strlen(pcVar6);
        pcVar8 = (char *)malloc(sVar7 + 1);
        strcpy(pcVar8,pcVar6);
      }
      *puVar9 = pcVar8;
      dVar2 = Mio_GateReadArea(pGate);
      *(float *)(puVar9 + 3) = (float)dVar2;
      *(undefined4 *)((long)puVar9 + 0x1c) = 0;
      *(undefined4 *)(puVar9 + 5) = 0;
      iVar3 = Mio_GateReadPinNum(pGate);
      *(int *)(puVar9 + 8) = iVar3;
      *(undefined4 *)((long)puVar9 + 0x44) = 1;
      puVar9[4] = CONCAT44((int)((float)((ulong)puVar9[3] >> 0x20) * 1000.0),
                           (int)((float)puVar9[3] * 1000.0));
      for (pMVar11 = Mio_GateReadPins(pGate); pMVar11 != (Mio_Pin_t *)0x0;
          pMVar11 = Mio_PinReadNext(pMVar11)) {
        puVar12 = (undefined8 *)calloc(1,0x50);
        *(undefined4 *)((long)puVar12 + 0x24) = 0xbf800000;
        uVar18 = *(uint *)((long)puVar9 + 0x34);
        if (uVar18 == *(uint *)(puVar9 + 6)) {
          if ((int)uVar18 < 0x10) {
            if ((void *)puVar9[7] == (void *)0x0) {
              pvVar13 = malloc(0x80);
            }
            else {
              pvVar13 = realloc((void *)puVar9[7],0x80);
            }
            puVar9[7] = pvVar13;
            *(undefined4 *)(puVar9 + 6) = 0x10;
          }
          else {
            if ((void *)puVar9[7] == (void *)0x0) {
              pvVar13 = malloc((ulong)uVar18 << 4);
            }
            else {
              pvVar13 = realloc((void *)puVar9[7],(ulong)uVar18 << 4);
            }
            puVar9[7] = pvVar13;
            *(uint *)(puVar9 + 6) = uVar18 * 2;
          }
        }
        else {
          pvVar13 = (void *)puVar9[7];
        }
        iVar3 = *(int *)((long)puVar9 + 0x34);
        *(int *)((long)puVar9 + 0x34) = iVar3 + 1;
        *(undefined8 **)((long)pvVar13 + (long)iVar3 * 8) = puVar12;
        *(undefined4 *)(puVar12 + 1) = 1;
        pcVar6 = Mio_PinReadName(pMVar11);
        if (pcVar6 == (char *)0x0) {
          pcVar8 = (char *)0x0;
        }
        else {
          sVar7 = strlen(pcVar6);
          pcVar8 = (char *)malloc(sVar7 + 1);
          strcpy(pcVar8,pcVar6);
        }
        *puVar12 = pcVar8;
        puVar12[2] = 0;
        puVar12[3] = 0;
      }
      if (0 < *(int *)((long)puVar9 + 0x44)) {
        iVar3 = 0;
        do {
          pwVar14 = Mio_GateReadTruthP(pGate);
          puVar12 = (undefined8 *)calloc(1,0x50);
          *(undefined4 *)((long)puVar12 + 0x24) = 0xbf800000;
          uVar18 = *(uint *)((long)puVar9 + 0x34);
          if (uVar18 == *(uint *)(puVar9 + 6)) {
            if ((int)uVar18 < 0x10) {
              if ((void *)puVar9[7] == (void *)0x0) {
                pvVar13 = malloc(0x80);
              }
              else {
                pvVar13 = realloc((void *)puVar9[7],0x80);
              }
              puVar9[7] = pvVar13;
              *(undefined4 *)(puVar9 + 6) = 0x10;
            }
            else {
              if ((void *)puVar9[7] == (void *)0x0) {
                pvVar13 = malloc((ulong)uVar18 << 4);
              }
              else {
                pvVar13 = realloc((void *)puVar9[7],(ulong)uVar18 << 4);
              }
              puVar9[7] = pvVar13;
              *(uint *)(puVar9 + 6) = uVar18 * 2;
            }
          }
          else {
            pvVar13 = (void *)puVar9[7];
          }
          iVar1 = *(int *)((long)puVar9 + 0x34);
          *(int *)((long)puVar9 + 0x34) = iVar1 + 1;
          *(undefined8 **)((long)pvVar13 + (long)iVar1 * 8) = puVar12;
          *(undefined4 *)(puVar12 + 1) = 2;
          pcVar6 = Mio_GateReadOutName(pGate);
          if (pcVar6 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            sVar7 = strlen(pcVar6);
            pcVar8 = (char *)malloc(sVar7 + 1);
            strcpy(pcVar8,pcVar6);
          }
          *puVar12 = pcVar8;
          puVar12[4] = 0;
          pcVar6 = Mio_GateReadForm(pGate);
          if (pcVar6 == (char *)0x0) {
            pcVar8 = (char *)0x0;
          }
          else {
            sVar7 = strlen(pcVar6);
            pcVar8 = (char *)malloc(sVar7 + 1);
            strcpy(pcVar8,pcVar6);
          }
          puVar12[5] = pcVar8;
          p_00 = (Vec_Wrd_t *)(puVar12 + 6);
          iVar1 = 1 << ((char)*(int *)(puVar9 + 8) - 6U & 0x1f);
          if (*(int *)(puVar9 + 8) < 7) {
            iVar1 = 1;
          }
          iVar4 = *(int *)(puVar12 + 6);
          if (*(int *)(puVar12 + 6) < iVar1) {
            if ((void *)puVar12[7] == (void *)0x0) {
              pvVar13 = malloc((long)iVar1 << 3);
            }
            else {
              pvVar13 = realloc((void *)puVar12[7],(long)iVar1 << 3);
            }
            puVar12[7] = pvVar13;
            if (pvVar13 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            p_00->nCap = iVar1;
            iVar4 = iVar1;
          }
          if (0 < iVar4) {
            lVar20 = 0;
            do {
              Vec_WrdPush(p_00,pwVar14[lVar20]);
              lVar20 = lVar20 + 1;
            } while (lVar20 < p_00->nCap);
          }
          for (pMVar11 = Mio_GateReadPins(pGate); pMVar11 != (Mio_Pin_t *)0x0;
              pMVar11 = Mio_PinReadNext(pMVar11)) {
            MVar5 = Mio_PinReadPhase(pMVar11);
            puVar15 = (undefined8 *)calloc(1,0x18);
            uVar18 = *(uint *)((long)puVar12 + 0x44);
            if (uVar18 == *(uint *)(puVar12 + 8)) {
              if ((int)uVar18 < 0x10) {
                if ((void *)puVar12[9] == (void *)0x0) {
                  pvVar13 = malloc(0x80);
                }
                else {
                  pvVar13 = realloc((void *)puVar12[9],0x80);
                }
                puVar12[9] = pvVar13;
                *(undefined4 *)(puVar12 + 8) = 0x10;
              }
              else {
                if ((void *)puVar12[9] == (void *)0x0) {
                  pvVar13 = malloc((ulong)uVar18 << 4);
                }
                else {
                  pvVar13 = realloc((void *)puVar12[9],(ulong)uVar18 << 4);
                }
                puVar12[9] = pvVar13;
                *(uint *)(puVar12 + 8) = uVar18 * 2;
              }
            }
            else {
              pvVar13 = (void *)puVar12[9];
            }
            iVar1 = *(int *)((long)puVar12 + 0x44);
            *(int *)((long)puVar12 + 0x44) = iVar1 + 1;
            *(undefined8 **)((long)pvVar13 + (long)iVar1 * 8) = puVar15;
            pcVar6 = Mio_PinReadName(pMVar11);
            if (pcVar6 == (char *)0x0) {
              pcVar8 = (char *)0x0;
            }
            else {
              sVar7 = strlen(pcVar6);
              pcVar8 = (char *)malloc(sVar7 + 1);
              strcpy(pcVar8,pcVar6);
            }
            *puVar15 = pcVar8;
            pvVar13 = calloc(1,0x2d8);
            uVar18 = *(uint *)((long)puVar15 + 0xc);
            if (uVar18 == *(uint *)(puVar15 + 1)) {
              if ((int)uVar18 < 0x10) {
                if ((void *)puVar15[2] == (void *)0x0) {
                  pvVar16 = malloc(0x80);
                }
                else {
                  pvVar16 = realloc((void *)puVar15[2],0x80);
                }
                puVar15[2] = pvVar16;
                *(undefined4 *)(puVar15 + 1) = 0x10;
              }
              else {
                if ((void *)puVar15[2] == (void *)0x0) {
                  pvVar16 = malloc((ulong)uVar18 << 4);
                }
                else {
                  pvVar16 = realloc((void *)puVar15[2],(ulong)uVar18 << 4);
                }
                puVar15[2] = pvVar16;
                *(uint *)(puVar15 + 1) = uVar18 * 2;
              }
            }
            else {
              pvVar16 = (void *)puVar15[2];
            }
            iVar1 = *(int *)((long)puVar15 + 0xc);
            *(int *)((long)puVar15 + 0xc) = iVar1 + 1;
            *(void **)((long)pvVar16 + (long)iVar1 * 8) = pvVar13;
            if (MIO_PHASE_NONINV < MVar5) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibScl.c"
                            ,0x9e,"int Abc_SclReadLibraryGenlib(SC_Lib *, Mio_Library_t *)");
            }
            *(Mio_PinPhase_t *)((long)pvVar13 + 8) = 3 - MVar5;
            Abc_SclReadSurfaceGenlib((SC_Surface *)((long)pvVar13 + 0x18));
            Abc_SclReadSurfaceGenlib((SC_Surface *)((long)pvVar13 + 200));
            Abc_SclReadSurfaceGenlib((SC_Surface *)((long)pvVar13 + 0x178));
            Abc_SclReadSurfaceGenlib((SC_Surface *)((long)pvVar13 + 0x228));
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 < *(int *)((long)puVar9 + 0x44));
      }
      pGate = Mio_GateReadNext(pGate);
      uVar17 = uVar17 + 1;
    } while (pGate != (Mio_Gate_t *)0x0);
  }
  Abc_SclHashCells(p);
  Abc_SclLinkCells(p);
  return p;
}

Assistant:

SC_Lib * Abc_SclReadFromGenlib( void * pLib0 )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pLib0;
    SC_Lib * p = Abc_SclLibAlloc();
    if ( !Abc_SclReadLibraryGenlib( p, pLib ) )
        return NULL;
    // hash gates by name
    Abc_SclHashCells( p );
    Abc_SclLinkCells( p );
    return p;
}